

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::TracingServiceImpl::CopyProducerPageIntoLogBuffer
          (TracingServiceImpl *this,ProducerID producer_id_trusted,uid_t producer_uid_trusted,
          pid_t producer_pid_trusted,WriterID writer_id,ChunkID chunk_id,BufferID buffer_id,
          uint16_t num_fragments,uint8_t chunk_flags,bool chunk_complete,uint8_t *src,size_t size)

{
  ProducerEndpointImpl *pPVar1;
  TraceBuffer *this_00;
  char *pcVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  undefined2 uVar6;
  bool bVar7;
  
  pPVar1 = GetProducer(this,producer_id_trusted);
  if (pPVar1 != (ProducerEndpointImpl *)0x0) {
    this_00 = GetBufferByID(this,buffer_id);
    if (this_00 != (TraceBuffer *)0x0) {
      p_Var5 = &(pPVar1->allowed_target_buffers_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (pPVar1->allowed_target_buffers_)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
      p_Var3 = &p_Var5->_M_header;
      for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[bVar7]) {
        bVar7 = (ushort)(short)p_Var4[1]._M_color < buffer_id;
        if (!bVar7) {
          p_Var3 = p_Var4;
        }
      }
      p_Var4 = &p_Var5->_M_header;
      if (((_Rb_tree_header *)p_Var3 != p_Var5) &&
         (p_Var4 = p_Var3, buffer_id < (ushort)(short)p_Var3[1]._M_color)) {
        p_Var4 = &p_Var5->_M_header;
      }
      if ((_Rb_tree_header *)p_Var4 == p_Var5) {
        pcVar2 = base::Basename(
                               "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                               );
        base::LogMessage(kLogError,pcVar2,0xe5ca,
                         "Producer %u tried to write into forbidden target buffer %u",
                         (ulong)producer_id_trusted,(ulong)buffer_id);
      }
      else {
        p_Var5 = &(pPVar1->writers_)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (pPVar1->writers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var3 = &p_Var5->_M_header;
        for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[bVar7]) {
          bVar7 = (ushort)(short)p_Var4[1]._M_color < writer_id;
          if (!bVar7) {
            p_Var3 = p_Var4;
          }
        }
        p_Var4 = &p_Var5->_M_header;
        if (((_Rb_tree_header *)p_Var3 != p_Var5) &&
           (p_Var4 = p_Var3, writer_id < (ushort)(short)p_Var3[1]._M_color)) {
          p_Var4 = &p_Var5->_M_header;
        }
        if ((_Rb_tree_header *)p_Var4 == p_Var5) {
          uVar6 = _S_red >> 0x10;
        }
        else {
          uVar6 = *(undefined2 *)((long)&p_Var4[1]._M_color + 2);
        }
        if (uVar6 == buffer_id || (_Rb_tree_header *)p_Var4 == p_Var5) {
          TraceBuffer::CopyChunkUntrusted
                    (this_00,producer_id_trusted,producer_uid_trusted,producer_pid_trusted,writer_id
                     ,chunk_id,num_fragments,chunk_flags,chunk_complete,src,size);
          return;
        }
        pcVar2 = base::Basename(
                               "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                               );
        base::LogMessage(kLogError,pcVar2,0xe5d9,
                         "Writer %u of producer %u was registered to write into target buffer %u, but tried to write into buffer %u"
                         ,(ulong)writer_id,(ulong)producer_id_trusted,(ulong)(ushort)uVar6,
                         (ulong)buffer_id);
      }
    }
  }
  this->chunks_discarded_ = this->chunks_discarded_ + 1;
  return;
}

Assistant:

void TracingServiceImpl::CopyProducerPageIntoLogBuffer(
    ProducerID producer_id_trusted,
    uid_t producer_uid_trusted,
    pid_t producer_pid_trusted,
    WriterID writer_id,
    ChunkID chunk_id,
    BufferID buffer_id,
    uint16_t num_fragments,
    uint8_t chunk_flags,
    bool chunk_complete,
    const uint8_t* src,
    size_t size) {
  PERFETTO_DCHECK_THREAD(thread_checker_);

  ProducerEndpointImpl* producer = GetProducer(producer_id_trusted);
  if (!producer) {
    PERFETTO_DFATAL("Producer not found.");
    chunks_discarded_++;
    return;
  }

  TraceBuffer* buf = GetBufferByID(buffer_id);
  if (!buf) {
    PERFETTO_DLOG("Could not find target buffer %" PRIu16
                  " for producer %" PRIu16,
                  buffer_id, producer_id_trusted);
    chunks_discarded_++;
    return;
  }

  // Verify that the producer is actually allowed to write into the target
  // buffer specified in the request. This prevents a malicious producer from
  // injecting data into a log buffer that belongs to a tracing session the
  // producer is not part of.
  if (!producer->is_allowed_target_buffer(buffer_id)) {
    PERFETTO_ELOG("Producer %" PRIu16
                  " tried to write into forbidden target buffer %" PRIu16,
                  producer_id_trusted, buffer_id);
    PERFETTO_DFATAL("Forbidden target buffer");
    chunks_discarded_++;
    return;
  }

  // If the writer was registered by the producer, it should only write into the
  // buffer it was registered with.
  base::Optional<BufferID> associated_buffer =
      producer->buffer_id_for_writer(writer_id);
  if (associated_buffer && *associated_buffer != buffer_id) {
    PERFETTO_ELOG("Writer %" PRIu16 " of producer %" PRIu16
                  " was registered to write into target buffer %" PRIu16
                  ", but tried to write into buffer %" PRIu16,
                  writer_id, producer_id_trusted, *associated_buffer,
                  buffer_id);
    PERFETTO_DFATAL("Wrong target buffer");
    chunks_discarded_++;
    return;
  }

  buf->CopyChunkUntrusted(producer_id_trusted, producer_uid_trusted,
                          producer_pid_trusted, writer_id, chunk_id,
                          num_fragments, chunk_flags, chunk_complete, src,
                          size);
}